

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

int WriteOptionPick(TidyOptionImpl *option,uint ival,StreamOut *out)

{
  int iVar1;
  PickListItem *pPVar2;
  bool bVar3;
  PickListItem *item;
  uint ix;
  StreamOut *out_local;
  uint ival_local;
  TidyOptionImpl *option_local;
  
  item._4_4_ = 0;
  if (option->pickList != (PickListItems *)0x0) {
    while( true ) {
      pPVar2 = *option->pickList + item._4_4_;
      bVar3 = false;
      if ((pPVar2 != (PickListItem *)0x0) && (bVar3 = false, pPVar2->label != (ctmbstr)0x0)) {
        bVar3 = item._4_4_ < ival;
      }
      if (!bVar3) break;
      item._4_4_ = item._4_4_ + 1;
    }
    if ((item._4_4_ == ival) && (pPVar2->label != (ctmbstr)0x0)) {
      iVar1 = WriteOptionString(option,pPVar2->label,out);
      return iVar1;
    }
  }
  return -1;
}

Assistant:

static int  WriteOptionPick( const TidyOptionImpl* option, uint ival, StreamOut* out )
{
    uint ix = 0;
    const PickListItem *item = NULL;
    
    if ( option-> pickList )
    {
        while ( (item = &(*option->pickList)[ ix ]) && item->label && ix<ival )
        {
            ++ix;
        }
        if ( ix==ival && item->label )
            return WriteOptionString( option, item->label, out );
    }
    
    return -1;
}